

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O3

double __thiscall booster::log::sinks::syslog::log(syslog *this,double __x)

{
  uint uVar1;
  undefined8 uVar2;
  size_t sVar3;
  int __pri;
  uint *in_RSI;
  char *__s;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar4;
  undefined1 *local_48;
  undefined1 local_38 [16];
  
  uVar1 = *in_RSI;
  __pri = 0;
  if (((((9 < (int)uVar1) && (__pri = 1, 0x13 < uVar1)) && (__pri = 2, 0x1d < uVar1)) &&
      ((__pri = 3, 0x27 < uVar1 && (__pri = 4, 0x31 < uVar1)))) && (__pri = 5, 0x3b < uVar1)) {
    __pri = 7 - (uint)(uVar1 < 0x46);
  }
  uVar2 = *(undefined8 *)(in_RSI + 2);
  std::__cxx11::stringbuf::str();
  __s = *(char **)(in_RSI + 4);
  sVar3 = strlen(__s);
  while ((0x2e < (byte)__s[sVar3] - 0x2f ||
         ((0x600000000801U >> ((ulong)((byte)__s[sVar3] - 0x2f) & 0x3f) & 1) == 0))) {
    if (sVar3 == 0) goto LAB_00169f4e;
    sVar3 = sVar3 - 1;
  }
  __s = __s + sVar3 + 1;
LAB_00169f4e:
  ::syslog(__pri,"%s: %s (%s:%d)",uVar2,local_48,__s,(ulong)in_RSI[6]);
  dVar4 = extraout_XMM0_Qa;
  if (local_48 != local_38) {
    operator_delete(local_48);
    dVar4 = extraout_XMM0_Qa_00;
  }
  return dVar4;
}

Assistant:

void syslog::log(message const &msg)
		{
			int syslevel;
			level_type l=msg.level();
			if(/*emergency <= l &&*/ l < alert)
				syslevel = LOG_EMERG;
			else if(alert <= l && l < critical)
				syslevel = LOG_ALERT;
			else if(critical <= l && l < error)
				syslevel = LOG_CRIT;
			else if(error <= l && l < warning)
				syslevel=LOG_ERR;
			else if(warning <= l && l < notice)
				syslevel = LOG_WARNING;
			else if(notice <= l && l< info)
				syslevel = LOG_NOTICE;
			else if(info <= l && l<debug)
				syslevel = LOG_INFO;
			else /*if(debug <= l)*/
				syslevel = LOG_DEBUG;
			::syslog(syslevel,"%s: %s (%s:%d)",msg.module(),msg.log_message().c_str(),msg.file_name(),msg.file_line());
		}